

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteKvIopageWrite(unqlite_page *pPage)

{
  Pager *pPager;
  Page *pPVar1;
  Page *pPVar2;
  Page *pPVar3;
  unqlite_file *pChunk;
  SyMemBackend *pBackend;
  sxu32 cksum;
  int iVar4;
  uint uVar5;
  sxu32 sVar6;
  ulong uVar7;
  Page *pPVar8;
  uchar *zBuf;
  long lVar9;
  Page **ppPVar10;
  char *zErr;
  unqlite *pDb;
  int local_144;
  Page *local_140;
  undefined8 local_138;
  Page *local_130 [32];
  
  if (pPage == (unqlite_page *)0x0) {
LAB_00115a83:
    iVar4 = 0;
  }
  else {
    pPager = (Pager *)pPage[1].zData;
    iVar4 = unqlitePagerBegin(pPager);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (pPager->iState == 2) {
      if ((pPager->is_mem == 0) && (pPager->no_jrnl == 0)) {
        (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
        iVar4 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,&pPager->pjfd,6);
        if (iVar4 != 0) {
          unqliteGenErrorFormat
                    (pPager->pDb,"IO error while opening journal file: %s",pPager->zJournal);
          return iVar4;
        }
        zBuf = (uchar *)SyMemBackendAlloc(pPager->pAllocator,pPager->iSectorSize);
        if (zBuf == (uchar *)0x0) {
          iVar4 = -1;
LAB_00115de7:
          pChunk = pPager->pjfd;
          if (pChunk != (unqlite_file *)0x0) {
            pBackend = pPager->pAllocator;
            (*pChunk->pMethods->xClose)(pChunk);
            SyMemBackendFree(pBackend,pChunk);
          }
          (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,0);
          pPager->pjfd = (unqlite_file *)0x0;
          return iVar4;
        }
        pager_write_journal_header(pPager,zBuf);
        iVar4 = (*pPager->pjfd->pMethods->xWrite)(pPager->pjfd,zBuf,(long)pPager->iSectorSize,0);
        pPager->iJournalOfft = (long)pPager->iSectorSize;
        SyMemBackendFree(pPager->pAllocator,zBuf);
        if (iVar4 != 0) goto LAB_00115de7;
      }
      pPager->iState = 3;
    }
    if (0x7f < pPager->nHot) {
      local_144 = 0;
      iVar4 = unqliteFinalizeJournal(pPager,&local_144,0);
      if ((iVar4 == 0) && (pPVar8 = pPager->pFirstHot, pPVar8 != (Page *)0x0)) {
        memset(&local_138,0,0x100);
        do {
          pPVar1 = pPVar8->pPrevHot;
          pPVar8->pPrevHot = (Page *)0x0;
          lVar9 = 0;
          do {
            if (local_130[lVar9 + -1] == (Page *)0x0) {
              local_130[lVar9 + -1] = pPVar8;
              goto LAB_00115b0f;
            }
            pPVar8 = page_merge_hot(local_130[lVar9 + -1],pPVar8);
            local_130[lVar9 + -1] = (Page *)0x0;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x1f);
          local_130[0x1e] = page_merge_hot(local_130[0x1e],pPVar8);
LAB_00115b0f:
          pPVar8 = pPVar1;
        } while (pPVar1 != (Page *)0x0);
        lVar9 = 1;
        pPVar8 = (Page *)CONCAT44(local_138._4_4_,(uint)local_138);
        do {
          pPVar8 = page_merge_hot(pPVar8,local_130[lVar9 + -1]);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x20);
        pPVar8->pNextHot = (Page *)0x0;
        if ((local_144 == 0) || (iVar4 = pager_wait_on_lock(pPager,4), iVar4 == 0)) {
          *(byte *)&pPager->iFlags = (byte)pPager->iFlags | 2;
          local_140 = (Page *)pPage;
          do {
            pPVar1 = pPVar8->pPrevHot;
            uVar5 = pPVar8->flags;
            if ((uVar5 & 8) == 0) {
              iVar4 = (*pPager->pfd->pMethods->xWrite)
                                (pPager->pfd,pPVar8->zData,(long)pPager->iPageSize,
                                 pPVar8->pgno * (long)pPager->iPageSize);
              if (iVar4 != 0) {
                *(byte *)&pPager->iFlags = (byte)pPager->iFlags | 1;
                unqliteGenError(pPager->pDb,
                                "IO error while writing hot dirty pages, rollback your database");
                unqliteGenError(pPager->pDb,"Please perform a rollback");
                return iVar4;
              }
              uVar5 = pPVar8->flags;
            }
            pPVar8->flags = uVar5 & 0xffffff91;
            pPVar2 = pPVar8->pDirtyNext;
            pPVar3 = pPVar8->pDirtyPrev;
            ppPVar10 = &pPVar3->pDirtyNext;
            if (pPVar3 == (Page *)0x0) {
              ppPVar10 = &pPager->pDirty;
            }
            *ppPVar10 = pPVar2;
            ppPVar10 = &pPVar2->pDirtyPrev;
            if (pPVar2 == (Page *)0x0) {
              ppPVar10 = &pPager->pFirstDirty;
            }
            *ppPVar10 = pPVar3;
            pager_unlink_page(pPager,pPVar8);
            pager_release_page(pPager,pPVar8);
            pPVar8 = pPVar1;
          } while (pPVar1 != (Page *)0x0);
          pPager->pHotDirty = (Page *)0x0;
          pPager->pFirstHot = (Page *)0x0;
          pPager->nHot = 0;
          pPage = (unqlite_page *)local_140;
        }
      }
    }
    if ((((pPager->is_mem == 0) && (pPager->no_jrnl == 0)) &&
        (uVar7 = ((Page *)pPage)->pgno, uVar7 < pPager->dbOrigSize)) &&
       (iVar4 = unqliteBitvecTest((Bitvec *)(ulong)pPager->pVec->nSize,(pgno)pPager->pVec->apRec),
       iVar4 == 0)) {
      if (pPager->nRec != 0xffffffff) {
        iVar4 = WriteInt64(pPager->pjfd,uVar7,pPager->iJournalOfft);
        if (iVar4 != 0) {
          return iVar4;
        }
        iVar4 = (*pPager->pjfd->pMethods->xWrite)
                          (pPager->pjfd,((Page *)pPage)->zData,(long)pPager->iPageSize,
                           pPager->iJournalOfft + 8);
        if (iVar4 != 0) {
          return iVar4;
        }
        sVar6 = pPager->cksumInit;
        lVar9 = (long)pPager->iPageSize;
        if (200 < lVar9) {
          uVar7 = lVar9 + 200;
          do {
            sVar6 = sVar6 + ((Page *)pPage)->zData[uVar7 - 400];
            uVar7 = uVar7 - 200;
          } while (400 < uVar7);
        }
        local_138._0_4_ =
             sVar6 >> 0x18 | (sVar6 & 0xff0000) >> 8 | (sVar6 & 0xff00) << 8 | sVar6 << 0x18;
        iVar4 = (*pPager->pjfd->pMethods->xWrite)
                          (pPager->pjfd,&local_138,4,lVar9 + pPager->iJournalOfft + 8);
        if (iVar4 != 0) {
          return iVar4;
        }
        pPager->iJournalOfft = (long)pPager->iPageSize + pPager->iJournalOfft + 0xc;
        pPager->nRec = pPager->nRec + 1;
        unqliteBitvecSet(pPager->pVec,((Page *)pPage)->pgno);
        goto LAB_00115a0d;
      }
      pDb = pPager->pDb;
      zErr = "Journal record limit reached, commit your changes";
    }
    else {
LAB_00115a0d:
      if ((((Page *)pPage)->flags & 2U) == 0) {
        ((Page *)pPage)->flags = ((Page *)pPage)->flags | 0x26;
        ((Page *)pPage)->pDirtyPrev = (Page *)0x0;
        pPVar8 = pPager->pDirty;
        ((Page *)pPage)->pDirtyNext = pPVar8;
        if (pPVar8 != (Page *)0x0) {
          pPVar8->pDirtyPrev = (Page *)pPage;
        }
        pPager->pDirty = (Page *)pPage;
        if (pPager->pFirstDirty == (Page *)0x0) {
          pPager->pFirstDirty = (Page *)pPage;
        }
      }
      uVar7 = ((Page *)pPage)->pgno + 1;
      if (uVar7 <= pPager->dbSize) goto LAB_00115a83;
      pPager->dbSize = uVar7;
      if (uVar7 != 0xffffffffffffffff) {
        return 0;
      }
      pDb = pPager->pDb;
      zErr = "Database maximum page limit (64-bit) reached";
    }
    unqliteGenError(pDb,zErr);
    iVar4 = -7;
  }
  return iVar4;
}

Assistant:

static int unqliteKvIopageWrite(unqlite_page *pPage)
{
	int rc;
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	rc = unqlitePageWrite(pPage);
	return rc;
}